

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O3

GMshFileV2 *
lf::io::readGmshFileV2
          (GMshFileV2 *__return_storage_ptr__,const_iterator begin,const_iterator end,
          string *version,bool is_binary,int size_t_size,int one,string *filename)

{
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
  *other;
  _func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  result_type rVar4;
  int iVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  ostream *poVar7;
  runtime_error *prVar8;
  long lVar9;
  type attr_;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  vec3;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  node;
  skipper_type skipper_;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV2::Element_(lf::io::GMshFileV2::ElementType,_int,_int),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  elementBin;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV2::Element_(),_boost::spirit::locals<int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  elementText;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_(),_boost::spirit::locals<unsigned_int,_int,_int,_int,_unsigned_int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  elementGroup;
  MshGrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mshGrammar;
  stringstream ss_2;
  char local_900 [8];
  undefined1 local_8f8 [32];
  string local_8d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b8;
  undefined1 local_8aa [2];
  undefined1 local_8a8 [8];
  undefined1 local_8a0 [8];
  undefined1 local_898 [8];
  undefined1 local_890 [16];
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  local_880;
  undefined1 local_860 [8];
  undefined1 local_858 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  local_838;
  string local_818;
  undefined8 *******local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::cons<lf::io::GMshFileV2::ElementType,_boost::fusion::cons<int,_boost::fusion::cons<int,_boost::fusion::nil_>_>_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  local_7d0;
  undefined1 local_7b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::nil_>,_boost::fusion::vector<int>_>_&,_const_boost::spirit::unused_type_&>
  local_788;
  undefined1 local_768 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
  local_740;
  undefined1 *local_720;
  undefined1 local_718 [16];
  undefined1 local_708 [24];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_6f0;
  proto_child1 local_6e8;
  car_type local_6e0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_(),_boost::spirit::locals<unsigned_int,_int,_int,_int,_unsigned_int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  local_388;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  local_340;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [23];
  undefined1 *local_170;
  _Alloc_hider local_168;
  undefined1 *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 **local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 **local_128;
  undefined1 **local_120;
  char *local_118;
  undefined1 ***local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 **local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 **local_d0;
  undefined1 *local_c8;
  undefined1 ***local_c0;
  char *local_b8;
  undefined1 ****local_b0;
  undefined1 **local_a8;
  undefined1 *****local_a0;
  char *local_98;
  undefined1 ******local_90;
  undefined1 *local_88;
  undefined1 *******local_80;
  char *local_78;
  undefined8 *******local_70;
  undefined1 *local_68;
  undefined8 *******local_60;
  char *local_58;
  undefined1 local_50 [8];
  undefined4 local_48;
  undefined1 local_40 [8];
  undefined4 local_38;
  
  local_8b8._M_current = begin._M_current;
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (version,"2.2");
  if (iVar5 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_718);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_708,"Version ",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_708,(version->_M_dataplus)._M_p,version->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," not supported by readGmshFileV2",0x20);
    local_2f8._0_8_ = local_2f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"version == \"2.2\"","");
    local_8a8 = (undefined1  [8])local_898;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2f8,(string *)local_8a8,0x263,(string *)local_860);
    if (local_860 != (undefined1  [8])((long)local_858 + 8)) {
      operator_delete((void *)local_860,local_858._8_8_ + 1);
    }
    if (local_8a8 != (undefined1  [8])local_898) {
      operator_delete((void *)local_8a8,(ulong)((long)local_898 + 1));
    }
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (size_t_size != 8) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_718);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_708,"Size of std::size_t must be 8.",0x1e);
    p_Var1 = (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
             (local_2f8 + 0x10);
    local_2f8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"size_t_size == 8","");
    local_8a8 = (undefined1  [8])local_898;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2f8,(string *)local_8a8,0x264,(string *)local_860);
    if (local_860 != (undefined1  [8])((long)local_858 + 8)) {
      operator_delete((void *)local_860,local_858._8_8_ + 1);
    }
    if (local_8a8 != (undefined1  [8])local_898) {
      operator_delete((void *)local_8a8,(ulong)((long)local_898 + 1));
    }
    if ((_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
        local_2f8._0_8_ != p_Var1) {
      operator_delete((void *)local_2f8._0_8_,local_2e8[0]._M_allocated_capacity + 1);
    }
    local_2f8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"false","");
    local_8a8 = (undefined1  [8])local_898;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
               ,"");
    local_860 = (undefined1  [8])((long)local_858 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_860,"");
    base::AssertionFailed((string *)local_2f8,(string *)local_8a8,0x264,(string *)local_860);
    std::__cxx11::string::~string((string *)local_860);
    std::__cxx11::string::~string((string *)local_8a8);
    std::__cxx11::string::~string((string *)local_2f8);
    abort();
  }
  (__return_storage_ptr__->VersionNumber)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->VersionNumber).field_2;
  (__return_storage_ptr__->VersionNumber)._M_string_length = 0;
  (__return_storage_ptr__->VersionNumber).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->DoubleSize = 0x40;
  (__return_storage_ptr__->PhysicalEntities).
  super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->PhysicalEntities).
  super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->PhysicalEntities).
  super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Nodes).
  super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Nodes).
  super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Nodes).
  super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Elements).
  super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Elements).
  super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Elements).
  super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Periodic).
  super__Vector_base<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Periodic).
  super__Vector_base<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Periodic).
  super__Vector_base<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->IsBinary = is_binary;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&__return_storage_ptr__->VersionNumber,version);
  __return_storage_ptr__->DoubleSize = 8;
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"unnamed-rule","");
  local_8a8 = (undefined1  [8])local_8a8;
  local_8a0 = (undefined1  [8])local_890;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_8a0,local_718._0_8_,(pointer)(local_718._8_8_ + local_718._0_8_));
  local_880.super_function_base.vtable = (vtable_base *)0x0;
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"unnamed-rule","");
  local_860 = (undefined1  [8])local_860;
  local_858._0_8_ = &local_848;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_858,local_718._0_8_,(pointer)(local_718._8_8_ + local_718._0_8_));
  local_838.super_function_base.vtable = (vtable_base *)0x0;
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"unnamed-rule","");
  local_7b0 = (undefined1  [8])local_7b0;
  local_7a8._M_dataplus._M_p = local_7b0 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_7b0 + 8),local_718._0_8_,(pointer)(local_718._8_8_ + local_718._0_8_))
  ;
  local_788.super_function_base.vtable = (vtable_base *)0x0;
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"unnamed-rule","");
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  local_7f8 = &local_7f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7f0,local_718._0_8_,(pointer)(local_718._8_8_ + local_718._0_8_));
  local_7d0.super_function_base.vtable = (vtable_base *)0x0;
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"unnamed-rule","");
  local_768 = (undefined1  [8])local_768;
  local_760._M_dataplus._M_p = local_768 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_768 + 8),local_718._0_8_,(pointer)(local_718._8_8_ + local_718._0_8_))
  ;
  local_740.super_function_base.vtable = (vtable_base *)0x0;
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  uVar2 = local_718._0_8_;
  other = (function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
           *)(local_768 + 0x28);
  if (is_binary) {
    if (one == 1) {
      boost::
      function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
      ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                   *)&local_880,
                  (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)1,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)1,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)1,_64>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
                   *)local_718);
      local_718._8_8_ = local_8a8;
      boost::
      function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,Eigen::Matrix<double,3,1,0,3,1>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
      ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,Eigen::Matrix<double,3,1,0,3,1>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                   *)&local_838,
                  (parser_binder<boost::spirit::qi::no_skip_directive<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
                   *)local_718);
      local_708._8_4_ = 2;
      local_6e8.proto_expr_.child0 = (expr_type)3;
      boost::
      function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::cons<lf::io::GMshFileV2::ElementType,_boost::fusion::cons<int,_boost::fusion::cons<int,_boost::fusion::nil_>_>_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&)>
      ::operator=<_c330f272_>
                ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::cons<lf::io::GMshFileV2::ElementType,_boost::fusion::cons<int,_boost::fusion::cons<int,_boost::fusion::nil_>_>_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&)>
                  *)&local_7d0,(parser_binder<_3ffe3ae7_> *)local_718);
      local_718._8_8_ = operator_new(0x98);
      (((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)local_718._8_8_)->
      super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
      ).proto_expr_.child0.ref.t_ =
           (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
            *)"$Elements";
      *(undefined4 *)
       &(((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
           *)local_718._8_8_)->name_).field_2 = 0;
      (((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)(local_718._8_8_ + 0x48))->name_)._M_string_length = (size_type)&local_7f8;
      (((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)(local_718._8_8_ + 0x48))->name_).field_2._M_local_buf[2] = '\0';
      *(char **)((long)&(((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
                           *)(local_718._8_8_ + 0x48))->f).
                        super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                        .super_function_base.functor + 0x10) = "$EndElements";
      local_718._0_8_ = null_ARRAY_00478a80;
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
      ::swap((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
              *)local_718,other);
    }
    else {
      boost::
      function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
      ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                   *)&local_880,
                  (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)0,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)0,_64>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<64>,_(boost::endian::order)0,_64>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
                   *)local_718);
      local_718._8_8_ = local_8a8;
      boost::
      function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,Eigen::Matrix<double,3,1,0,3,1>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
      ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,Eigen::Matrix<double,3,1,0,3,1>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                   *)&local_838,
                  (parser_binder<boost::spirit::qi::no_skip_directive<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
                   *)local_718);
      local_708._8_4_ = 2;
      local_6e8.proto_expr_.child0 = (expr_type)3;
      boost::
      function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::cons<lf::io::GMshFileV2::ElementType,_boost::fusion::cons<int,_boost::fusion::cons<int,_boost::fusion::nil_>_>_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&)>
      ::operator=<_d30525b0_>
                ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::cons<lf::io::GMshFileV2::ElementType,_boost::fusion::cons<int,_boost::fusion::cons<int,_boost::fusion::nil_>_>_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&)>
                  *)&local_7d0,(parser_binder<_92225a5_> *)local_718);
      local_718._8_8_ = operator_new(0x98);
      (((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)local_718._8_8_)->
      super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
      ).proto_expr_.child0.ref.t_ =
           (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
            *)"$Elements";
      *(undefined4 *)
       &(((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
           *)local_718._8_8_)->name_).field_2 = 0;
      (((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)(local_718._8_8_ + 0x48))->name_)._M_string_length = (size_type)&local_7f8;
      (((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)(local_718._8_8_ + 0x48))->name_).field_2._M_local_buf[2] = '\0';
      *(char **)((long)&(((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
                           *)(local_718._8_8_ + 0x48))->f).
                        super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                        .super_function_base.functor + 0x10) = "$EndElements";
      local_718._0_8_ = null_ARRAY_00478aa0;
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
      ::swap((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
              *)local_718,other);
    }
    boost::
    function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
    ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
                   *)local_718);
  }
  else {
    local_718[1] = 0x20;
    uVar3 = local_718._0_8_;
    local_718._4_4_ = SUB84(uVar2,4);
    local_718._0_3_ = (undefined3)uVar3;
    local_718[3] = 0x20;
    boost::
    function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
    ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,3,1,0,3,1>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                 *)&local_880,
                (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::any_real_parser<double,_boost::spirit::qi::real_policies<double>_>,_boost::fusion::nil_>_>_>_>_>_>,_mpl_::bool_<false>_>
                 *)local_718);
    local_718[8] = 0x20;
    local_708._0_8_ = local_8a8;
    boost::
    function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,Eigen::Matrix<double,3,1,0,3,1>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
    ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,Eigen::Matrix<double,3,1,0,3,1>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                 *)&local_838,
                (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_uint_parser<unsigned_int,_10U,_1U,__1>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<false>_>
                 *)local_718);
    local_d8 = local_900 + 7;
    builtin_strncpy(local_900,"        ",8);
    local_d0 = &local_e0;
    local_e0 = &boost::spirit::int_;
    local_c0 = &local_d0;
    local_c8 = &boost::spirit::int_;
    local_b8 = local_900 + 6;
    local_b0 = &local_c0;
    local_e8 = &local_100;
    local_100 = &boost::spirit::int_;
    local_f8 = local_8aa;
    local_a8 = &local_f0;
    local_f0 = &boost::spirit::omit;
    local_a0 = &local_b0;
    local_98 = local_900 + 5;
    local_90 = &local_a0;
    local_80 = &local_90;
    local_88 = &boost::spirit::int_;
    local_78 = local_900 + 4;
    local_70 = &local_80;
    local_60 = &local_70;
    local_68 = &boost::spirit::int_;
    local_58 = local_900 + 3;
    local_818._M_dataplus._M_p = (pointer)&local_60;
    local_130 = local_40;
    local_38 = 2;
    local_128 = &local_140;
    local_140 = &boost::spirit::omit;
    local_138 = &boost::spirit::int_;
    local_120 = &local_130;
    local_118 = local_900 + 2;
    local_110 = &local_120;
    local_818._M_string_length = (size_type)&local_110;
    local_108 = &boost::spirit::eps;
    local_8f8._0_8_ = &local_818;
    local_158._8_8_ = local_50;
    local_48 = 3;
    local_158._M_allocated_capacity = (size_type)(local_900 + 1);
    local_148 = &local_160;
    local_160 = &boost::spirit::int_;
    local_8f8._8_8_ = local_158._M_local_buf + 8;
    local_8d8._M_dataplus._M_p = local_8f8;
    local_168._M_p = local_900;
    local_8d8._M_string_length = (size_type)&local_170;
    local_170 = &boost::spirit::uint_;
    local_2f8._0_8_ = &local_8d8;
    local_2f8._8_8_ = &local_720;
    local_720 = &boost::spirit::standard::blank;
    local_718._0_8_ = local_2f8;
    local_718._8_8_ = &boost::spirit::eol;
    boost::spirit::qi::
    rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV2::Element_(),_boost::spirit::locals<int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
    ::define<_42ab5f34_>(local_7b0);
    local_718._0_8_ = "$Elements";
    local_6f0.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
            )local_7b0;
    local_6e0.str = (char (*) [13])0x3d4e13;
    boost::
    function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&)>
    ::operator=<_f3d9f3e5_>
              ((function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&)>
                *)other,(parser_binder<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[10],_true>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::cons<boost::spirit::qi::omit_directive<boost::spirit::qi::action<boost::spirit::qi::any_uint_parser<unsigned_int,_10U,_1U,__1>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::local_variable<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_2L>_>_>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::cons<boost::spirit::qi::lazy_directive<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::repeat>,_boost::phoenix::actor<boost::spirit::local_variable<0>_>_>,_2L>_>,_boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV2::Element_(),_boost::spirit::locals<int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[13],_true>,_boost::fusion::nil_>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                         *)local_718);
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"vec3","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718);
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"node","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718);
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"element","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_7b0 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718);
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"element","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_7f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718);
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  local_718._0_8_ = (vtable_base *)local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"ElementSection","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_768 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718);
  if ((vtable_base *)local_718._0_8_ != (vtable_base *)local_708) {
    operator_delete((void *)local_718._0_8_,(ulong)(local_708._0_8_ + 1));
  }
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&local_340,
         (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_860);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_(),_boost::spirit::locals<unsigned_int,_int,_int,_int,_unsigned_int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&local_388,
         (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_(),_boost::spirit::locals<unsigned_int,_int,_int,_int,_unsigned_int,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_768);
  anon_unknown_1::
  MshGrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::MshGrammarText((MshGrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_718,&local_340,&local_388);
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
  ::~function_n(&local_388.f.
                 super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
               );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.name_._M_dataplus._M_p != &local_388.name_.field_2) {
    operator_delete(local_388.name_._M_dataplus._M_p,
                    local_388.name_.field_2._M_allocated_capacity + 1);
  }
  boost::
  function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  ::~function_n(&local_340.f.
                 super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
               );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.name_._M_dataplus._M_p != &local_340.name_.field_2) {
    operator_delete(local_340.name_._M_dataplus._M_p,
                    local_340.name_.field_2._M_allocated_capacity + 1);
  }
  local_8f8._0_8_ = end._M_current;
  if (((vtable_base *)(local_718._0_8_ + 0x28))->manager !=
      (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x0) {
    local_2f8._0_8_ = &local_8d8;
    local_8d8._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    rVar4 = boost::
            function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileAdapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
            ::operator()((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileAdapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                          *)(local_718._0_8_ + 0x28),&local_8b8,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_8f8,
                         (context<boost::fusion::cons<boost::fusion::adapted::MshFileAdapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>
                          *)local_2f8,
                         (char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>
                          *)&local_818);
    _Var6._M_current = local_8b8._M_current;
    if (rVar4) {
      while (((local_8b8._M_current != (char *)local_8f8._0_8_ &&
              (lVar9 = (long)(char)((pointer)local_8b8._M_current)->first,
              _Var6._M_current = local_8b8._M_current, -1 < lVar9)) &&
             ((boost::spirit::char_encoding::ascii_char_types[lVar9] & 0x40) != 0))) {
        local_8b8._M_current = (char *)((long)&((pointer)local_8b8._M_current)->first + 1);
        _Var6._M_current = (char *)local_8f8._0_8_;
      }
      if (_Var6._M_current != end._M_current) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2f8 + 0x10),"Could not parse all of file ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2f8 + 0x10),(filename->_M_dataplus)._M_p,
                   filename->_M_string_length);
        local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"begin == end","");
        local_8f8._0_8_ = local_8f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_8d8,(string *)local_8f8,0x2de,&local_818);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_dataplus._M_p != &local_818.field_2) {
          operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
          operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
          operator_delete(local_8d8._M_dataplus._M_p,
                          (ulong)(local_8d8.field_2._M_allocated_capacity + 1));
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"this code should not be reached");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      anon_unknown_1::
      MshGrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~MshGrammarText((MshGrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_718);
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<unsigned_int,_int,_int,_int,_unsigned_int>_>_&,_const_boost::spirit::unused_type_&>
      ::~function_n(other);
      if (local_760._M_dataplus._M_p != local_768 + 0x18) {
        operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
      }
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::cons<lf::io::GMshFileV2::ElementType,_boost::fusion::cons<int,_boost::fusion::cons<int,_boost::fusion::nil_>_>_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
      ::~function_n(&local_7d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::nil_>,_boost::fusion::vector<int>_>_&,_const_boost::spirit::unused_type_&>
      ::~function_n((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<lf::io::GMshFileV2::Element_&,_boost::fusion::nil_>,_boost::fusion::vector<int>_>_&,_const_boost::spirit::unused_type_&>
                     *)(local_7b0 + 0x28));
      if (local_7a8._M_dataplus._M_p != local_7b0 + 0x18) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
      ::~function_n(&local_838);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._0_8_ != &local_848) {
        operator_delete((void *)local_858._0_8_,local_848._M_allocated_capacity + 1);
      }
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
      ::~function_n(&local_880);
      if (local_8a0 != (undefined1  [8])local_890) {
        operator_delete((void *)local_8a0,(ulong)(local_890._0_8_ + 1));
      }
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_2f8 + 0x10),"Could not parse file ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_2f8 + 0x10),(filename->_M_dataplus)._M_p,filename->_M_string_length);
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"r","");
  local_8f8._0_8_ = local_8f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_8d8,(string *)local_8f8,0x2dd,&local_818);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_8f8._0_8_ != local_8f8 + 0x10) {
    operator_delete((void *)local_8f8._0_8_,local_8f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,(ulong)(local_8d8.field_2._M_allocated_capacity + 1))
    ;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"this code should not be reached");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GMshFileV2 readGmshFileV2(std::string::const_iterator begin,
                          std::string::const_iterator end,
                          const std::string& version, bool is_binary,
                          int size_t_size, int one,
                          const std::string& filename) {
  LF_VERIFY_MSG(version == "2.2",
                "Version " << version << " not supported by readGmshFileV2");
  LF_ASSERT_MSG(size_t_size == 8, "Size of std::size_t must be 8.");

  GMshFileV2 result;
  result.IsBinary = is_binary;
  result.VersionNumber = version;
  result.DoubleSize = size_t_size;

  // Parse the rest of the document
  //////////////////////////////////////////////////////////////////////////

  // Setup parsers for node/element sections (which are different depending on
  // binary/non-binary files):
  //
  // Note vec3 has no skipper because it may be used inside lexeme and lexeme
  // can only use parsers without skippers!
  // http://boost-spirit.com/home/2010/02/24/parsing-skippers-and-skipping-parsers/
  // (see comment section)
  using iterator_t = std::string::const_iterator;
  qi::rule<iterator_t, Eigen::Vector3d> vec3;
  qi::rule<iterator_t, std::pair<size_type, Eigen::Vector3d>()> node;
  qi::rule<iterator_t, GMshFileV2::Element(), qi::locals<int>> elementText;
  qi::rule<iterator_t, GMshFileV2::Element(GMshFileV2::ElementType, int, int)>
      elementBin;
  qi::rule<iterator_t, std::vector<GMshFileV2::Element>(),
           qi::locals<size_type, int, int, int, size_type>>
      elementGroup;

  using phoenix::reserve;
  using qi::omit;
  using qi::repeat;
  using qi::labels::_a;
  using qi::labels::_b;
  using qi::labels::_c;
  using qi::labels::_d;
  using qi::labels::_e;
  using qi::labels::_r1;
  using qi::labels::_r2;
  using qi::labels::_r3;
  using qi::labels::_val;

  if (!is_binary) {
    // Text file
    vec3 = qi::double_ >> ' ' >> qi::double_ >> ' ' >> qi::double_;
    node = qi::uint_ >> ' ' >> vec3 >> qi::eol;
    elementText %= qi::int_ > ' ' > qi::int_ > ' ' >
                   qi::omit[qi::int_[qi::_a = qi::_1]] > ' ' > qi::int_ > ' ' >
                   qi::int_ > ' ' >
                   ((qi::eps(_a > 2) >> omit[qi::int_] >> ' ') || qi::eps) >
                   qi::repeat(qi::_a - 3)[qi::int_ >> ' '] > (qi::uint_ % ' ') >
                   *(qi::blank) > qi::eol;
    elementGroup %= "$Elements" > qi::eol >
                    qi::omit[qi::uint_[(phoenix::reserve(qi::_val, qi::_1),
                                        qi::_a = qi::_1)]] > qi::eol >
                    qi::repeat(qi::_a)[elementText] > "$EndElements";
  } else if (is_binary && one == 1) {
    // Binary File Little Endian
    // std::cout << "little endian" << std::endl;
    vec3 %=
        qi::little_bin_double >> qi::little_bin_double >> qi::little_bin_double;
    node %= qi::no_skip[qi::little_dword >> vec3];
    elementBin %= qi::little_dword >> qi::attr(_r1) >> qi::little_dword >>
                  qi::little_dword >>
                  ((qi::eps(_r2 > 2) >> omit[qi::little_dword]) || qi::eps) >>
                  qi::repeat(_r2 - 3)[qi::little_dword] >>
                  qi::repeat(_r3)[qi::little_dword];
    elementGroup %=
        "$Elements" >> qi::eol >> qi::eps[_e = 0] >>
        omit[qi::uint_[(reserve(_val, qi::_1), _a = qi::_1)]] >>
        qi::eol  // # Elements in total
        >>
        omit[*((qi::eps(_e < _a) >> qi::little_dword[_b = qi::_1] >>
                qi::little_dword[_c = qi::_1] >>
                qi::little_dword[_d = qi::_1]  // elements-header-binary
                >> repeat(_c)[elementBin(
                       phoenix::static_cast_<GMshFileV2::ElementType>(_b), _d,
                       numNodesAdapted(
                           phoenix::static_cast_<GMshFileV2::ElementType>(
                               _b)))[phoenix::push_back(_val, qi::_1)]]) >>
               qi::eps[_e += _c])]  // elements-binary
        >> qi::eol >> "$EndElements";
  } else {
    // std::cout << "big endian" << std::endl;
    // Binary File Big Endian
    vec3 %= qi::big_bin_double >> qi::big_bin_double >> qi::big_bin_double;
    node %= qi::no_skip[qi::big_dword >> vec3];
    elementBin %=
        qi::big_dword >> qi::attr(_r1) >> qi::big_dword >> qi::big_dword >>
        ((qi::eps(_r2 > 2) >> omit[qi::big_dword]) || qi::eps) >>
        qi::repeat(_r2 - 3)[qi::big_dword] >> qi::repeat(_r3)[qi::big_dword];
    elementGroup %=
        "$Elements" >> qi::eol >> qi::eps[_e = 0] >>
        omit[qi::uint_[(reserve(_val, qi::_1), _a = qi::_1)]] >>
        qi::eol  // # Elements in total
        >>
        omit[*((qi::eps(_e < _a) >> qi::big_dword[_b = qi::_1] >>
                qi::big_dword[_c = qi::_1] >>
                qi::big_dword[_d = qi::_1]  // elements-header-binary
                >> repeat(_c)[elementBin(
                       phoenix::static_cast_<GMshFileV2::ElementType>(_b), _d,
                       numNodesAdapted(
                           phoenix::static_cast_<GMshFileV2::ElementType>(
                               _b)))[phoenix::push_back(_val, qi::_1)]]) >>
               qi::eps[_e += _c])]  // elements-binary
        >> qi::eol >> "$EndElements";
  }

  /// Name the elements for better error parsing:
  vec3.name("vec3");
  node.name("node");
  elementText.name("element");
  elementBin.name("element");
  elementGroup.name("ElementSection");

  // Finally parse everything:
  const MshGrammarText<iterator_t> mshGrammar(node, elementGroup);
  const bool r = qi::phrase_parse(begin, end, mshGrammar, ascii::space, result);

  // if (r && iter == end) std::cout << "Parsing succeeded" << std::endl;
  // else if (r) std::cout << "Parsing partially succeeded" << std::endl;
  // std::cout << result << std::endl;

  LF_VERIFY_MSG(r, "Could not parse file " << filename);
  LF_VERIFY_MSG(begin == end, "Could not parse all of file " << filename);

  return result;
}